

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Converter.cpp
# Opt level: O0

bool __thiscall
Process::Converter::redirect
          (Converter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v)

{
  bool bVar1;
  const_reference pvVar2;
  string *__rhs;
  size_type sVar3;
  const_reference RV;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v_local;
  Converter *this_local;
  
  local_20 = v;
  v_local = &this->_contVar;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](v,0);
  std::operator+(&local_60,"rsrc/C/",pvVar2);
  std::operator+(&local_40,&local_60,".txt");
  Parsing::File::setPath(&this->_f,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = Parsing::File::isFile(&this->_f);
  if (bVar1) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    if (sVar3 == 3) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,1);
      RV = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_20,2);
      this_local._7_1_ = transcript(this,pvVar2,RV);
    }
    else {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      if (sVar3 == 2) {
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,1);
        this_local._7_1_ = transcript(this,pvVar2);
      }
      else {
        this_local._7_1_ = transcript(this);
      }
    }
  }
  else {
    __rhs = Parsing::File::getPath_abi_cxx11_(&this->_f);
    std::operator+(&local_b0,"Missing file : ",__rhs);
    std::operator+(&local_90,&local_b0," in rsrc!");
    this_local._7_1_ = error(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Converter::redirect(const std::vector<std::string> &v)
    {
        _f.setPath("rsrc/C/" + v[0] + ".txt");
        if (!_f.isFile())
            return error("Missing file : " + _f.getPath() + " in rsrc!");

        if (v.size() == 3)
            return transcript(v[1], v[2]);
        else if (v.size() == 2)
            return transcript(v[1]);
        return transcript();
    }